

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vectors.h
# Opt level: O0

Vector<float> * __thiscall Vector<float>::operator=(Vector<float> *this,float *val)

{
  float *in_RSI;
  Vector<float> *in_RDI;
  int i;
  allocator<char> local_39;
  string local_38 [8];
  allocator<char> *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  int local_14;
  
  if (in_RDI->num_elts == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
    ::error((string *)0x10b8aae);
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator(&local_39);
  }
  else {
    for (local_14 = 0; local_14 < in_RDI->num_elts; local_14 = local_14 + 1) {
      in_RDI->ptr_to_data[local_14] = *in_RSI;
    }
  }
  return in_RDI;
}

Assistant:

Vector< T >& Vector< T >::operator = (const T& val)
{
  if (num_elts != 0)
    for (int i=0; i<num_elts; ++i)
      ptr_to_data[i] = val;
  else error("Vector< T >& Vector< T >::operator = (const T& val), unallocated vector");

  return *this;
}